

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

int prf_array_find_int(void *id,int elem)

{
  array *paVar1;
  int in_ESI;
  void *in_RDI;
  int *ptr;
  int n;
  int i;
  int local_18;
  
  paVar1 = id_to_array(in_RDI);
  local_18 = 0;
  while( true ) {
    if ((int)(*(uint *)&paVar1->field_0x4 >> 4) <= local_18) {
      return -1;
    }
    if (*(int *)((long)in_RDI + (long)local_18 * 4) == in_ESI) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int 
prf_array_find_int(void *id, int elem)
{
  int i,n;
  int *ptr;

  n = id_to_array(id)->numelem;
  ptr = (int*)id;

  for (i = 0; i < n; i++) if (ptr[i] == elem) return i;
  return -1;
}